

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::UnionDatatypeValidator::init(UnionDatatypeValidator *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  XMLSize_t XVar2;
  XMLCh *text1;
  XMLCh *pattern;
  bool bVar3;
  KVStringPair *toCopy;
  char16_t *pcVar4;
  EVP_PKEY_CTX *extraout_RAX;
  InvalidDatatypeFacetException *this_00;
  RefArrayVectorOf<char16_t> *in_RCX;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *in_RDX;
  MemoryManager *in_R8;
  XMLSize_t getAt;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  KVStringPair pair;
  
  if (in_RCX != (RefArrayVectorOf<char16_t> *)0x0) {
    setEnumeration(this,in_RCX,false);
  }
  if (in_RDX != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&e,in_RDX,false,in_R8);
    while ((e.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (e.fCurHash != (e.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&e);
      KVStringPair::KVStringPair(&pair,toCopy);
      pattern = pair.fValue;
      text1 = pair.fKey;
      bVar3 = XMLString::equals(pair.fKey,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (!bVar3) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
                   ,0xa2,FACET_Invalid_Tag,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,in_R8);
        __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
      DatatypeValidator::setPattern(&this->super_DatatypeValidator,pattern);
      if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
        piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
        *(byte *)piVar1 = (byte)*piVar1 | 8;
      }
      KVStringPair::~KVStringPair(&pair);
    }
    if ((((this->super_DatatypeValidator).fFacetsDefined & 0x10) != 0) &&
       (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
      XVar2 = (this->fEnumeration->super_BaseRefVectorOf<char16_t>).fCurCount;
      for (getAt = 0; XVar2 != getAt; getAt = getAt + 1) {
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt
                           (&this->fEnumeration->super_BaseRefVectorOf<char16_t>,getAt);
        (**(code **)(*(long *)ctx + 0x40))(ctx,pcVar4,0,in_R8);
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&e);
  }
  if ((((byte)ctx[0x14] & 0x10) != 0) &&
     (((this->super_DatatypeValidator).fFacetsDefined & 0x10) == 0)) {
    setEnumeration(this,*(RefArrayVectorOf<char16_t> **)(ctx + 0x70),true);
    ctx = extraout_RAX;
  }
  return (int)ctx;
}

Assistant:

void UnionDatatypeValidator::init(DatatypeValidator*            const baseValidator
                                , RefHashTableOf<KVStringPair>* const facets
                                , RefArrayVectorOf<XMLCh>*      const enums
                                , MemoryManager*                const manager)
{
    if (enums)
        setEnumeration(enums, false);

    // Set Facets if any defined
    if (facets)
    {
        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                if (getPattern())
                    setFacetsDefined(DatatypeValidator::FACET_PATTERN);
                // do not construct regex until needed
            }
            else
            {
                 ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                         , XMLExcepts::FACET_Invalid_Tag
                         , key
                         , manager);
            }
        }//while

        /***
           Schema constraint: Part I -- self checking
        ***/
        // Nil

        /***
           Schema constraint: Part II base vs derived checking
        ***/
        // check 4.3.5.c0 must: enumeration values from the value space of base
        if ( ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) != 0) &&
            (getEnumeration() !=0))
        {
            XMLSize_t i = 0;
            XMLSize_t enumLength = getEnumeration()->size();
            try
            {
                for ( ; i < enumLength; i++)
                {
                    // ask parent do a complete check
                    //
                    // enum need NOT be passed this->checkContent()
                    // since there are no other facets for Union, parent
                    // checking is good enough.
                    //
                    baseValidator->validate(getEnumeration()->elementAt(i), (ValidationContext*)0, manager);

                }
            }

            catch ( XMLException& )
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                            , XMLExcepts::FACET_enum_base
                            , getEnumeration()->elementAt(i)
                            , manager);
            }
        }

    }// End of Facet setting

    /***
        Inherit facets from base.facets

        The reason of this inheriting (or copying values) is to ease
        schema constraint checking, so that we need NOT trace back to our
        very first base validator in the hierachy. Instead, we are pretty
        sure checking against immediate base validator is enough.
    ***/

    UnionDatatypeValidator *pBaseValidator = (UnionDatatypeValidator*) baseValidator;

    // inherit enumeration
    if (((pBaseValidator->getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) !=0) &&
        ((getFacetsDefined() & DatatypeValidator::FACET_ENUMERATION) == 0))
    {
        setEnumeration(pBaseValidator->getEnumeration(), true);
    }

}